

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_shadow_box.cxx
# Opt level: O0

void fl_shadow_frame(int x,int y,int w,int h,Fl_Color c)

{
  Fl_Color c_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  
  fl_color(0x27);
  fl_rectf(x + 3,y + h + -3,w + -3,3);
  fl_rectf(x + w + -3,y + 3,3,h + -3);
  Fl::set_box_color(c);
  fl_rect(x,y,w + -3,h + -3);
  return;
}

Assistant:

static void fl_shadow_frame(int x, int y, int w, int h, Fl_Color c) {
  fl_color(FL_DARK3);
  fl_rectf(x+BW, y+h-BW,  w - BW, BW);
  fl_rectf(x+w-BW,  y+BW, BW,  h - BW);
  Fl::set_box_color(c);
  fl_rect(x,y,w-BW,h-BW);
}